

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowCodeInit(Parse *pParse,Window *pMWin)

{
  int p2;
  Window **ppWVar1;
  char *pcVar2;
  Op *pOVar3;
  int iVar4;
  Vdbe *p;
  KeyInfo *p4;
  Window *pWVar5;
  int iVar6;
  int iVar7;
  
  p = sqlite3GetVdbe(pParse);
  iVar6 = 0;
  iVar4 = 0;
  if (pMWin->pPartition != (ExprList *)0x0) {
    iVar4 = pMWin->pPartition->nExpr;
  }
  if (pMWin->pOrderBy != (ExprList *)0x0) {
    iVar6 = pMWin->pOrderBy->nExpr;
  }
  if (iVar6 + iVar4 != 0) {
    iVar7 = pParse->nMem;
    p2 = iVar7 + 1;
    pMWin->regPart = p2;
    iVar7 = iVar6 + iVar4 + iVar7;
    pParse->nMem = iVar7;
    sqlite3VdbeAddOp3(p,0x49,0,p2,iVar7);
  }
  pWVar5 = pMWin;
  if (pMWin != (Window *)0x0) {
    do {
      if (((pWVar5->pFunc->funcFlags & 0x1000) == 0) || (pWVar5->eStart == 'W')) {
        pcVar2 = pWVar5->pFunc->zName;
        if (pcVar2 == "nth_value" || pcVar2 == "first_value") {
          iVar6 = pParse->nMem;
          pWVar5->regApp = iVar6 + 1;
          iVar4 = pParse->nTab;
          pParse->nTab = iVar4 + 1;
          pWVar5->csrApp = iVar4;
          pParse->nMem = iVar6 + 2;
        }
        else {
          if (pcVar2 != "lead" && pcVar2 != "lag") goto LAB_00175cb4;
          iVar4 = pParse->nTab;
          pParse->nTab = iVar4 + 1;
          pWVar5->csrApp = iVar4;
        }
        sqlite3VdbeAddOp3(p,0x6f,iVar4,pMWin->iEphCsr,0);
      }
      else {
        p4 = sqlite3KeyInfoFromExprList(pParse,(pWVar5->pOwner->x).pList,0,0);
        iVar4 = pParse->nTab;
        pParse->nTab = iVar4 + 1;
        pWVar5->csrApp = iVar4;
        iVar4 = pParse->nMem;
        pWVar5->regApp = iVar4 + 1;
        pParse->nMem = iVar4 + 3;
        if ((p4 != (KeyInfo *)0x0) && (pWVar5->pFunc->zName[1] == 'i')) {
          *p4->aSortOrder = '\x01';
        }
        sqlite3VdbeAddOp3(p,0x71,pWVar5->csrApp,2,0);
        if (p->db->mallocFailed == '\0') {
          pOVar3 = p->aOp;
          iVar4 = p->nOp;
          pOVar3[(long)iVar4 + -1].p4type = -9;
          pOVar3[(long)iVar4 + -1].p4.pKeyInfo = p4;
        }
        else {
          freeP4(p->db,-9,p4);
        }
        sqlite3VdbeAddOp3(p,0x46,0,pWVar5->regApp + 1,0);
      }
LAB_00175cb4:
      ppWVar1 = &pWVar5->pNextWin;
      pWVar5 = *ppWVar1;
    } while (*ppWVar1 != (Window *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeInit(Parse *pParse, Window *pMWin){
  Window *pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int nPart = (pMWin->pPartition ? pMWin->pPartition->nExpr : 0);
  nPart += (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
  if( nPart ){
    pMWin->regPart = pParse->nMem+1;
    pParse->nMem += nPart;
    sqlite3VdbeAddOp3(v, OP_Null, 0, pMWin->regPart, pMWin->regPart+nPart-1);
  }

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *p = pWin->pFunc;
    if( (p->funcFlags & SQLITE_FUNC_MINMAX) && pWin->eStart!=TK_UNBOUNDED ){
      /* The inline versions of min() and max() require a single ephemeral
      ** table and 3 registers. The registers are used as follows:
      **
      **   regApp+0: slot to copy min()/max() argument to for MakeRecord
      **   regApp+1: integer value used to ensure keys are unique
      **   regApp+2: output of MakeRecord
      */
      ExprList *pList = pWin->pOwner->x.pList;
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pList, 0, 0);
      pWin->csrApp = pParse->nTab++;
      pWin->regApp = pParse->nMem+1;
      pParse->nMem += 3;
      if( pKeyInfo && pWin->pFunc->zName[1]=='i' ){
        assert( pKeyInfo->aSortOrder[0]==0 );
        pKeyInfo->aSortOrder[0] = 1;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pWin->csrApp, 2);
      sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
    }
    else if( p->zName==nth_valueName || p->zName==first_valueName ){
      /* Allocate two registers at pWin->regApp. These will be used to
      ** store the start and end index of the current frame.  */
      assert( pMWin->iEphCsr );
      pWin->regApp = pParse->nMem+1;
      pWin->csrApp = pParse->nTab++;
      pParse->nMem += 2;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
    else if( p->zName==leadName || p->zName==lagName ){
      assert( pMWin->iEphCsr );
      pWin->csrApp = pParse->nTab++;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
  }
}